

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

void __thiscall
pbrt::WeightedReservoirSampler<pbrt::LightHandle>::Add
          (WeightedReservoirSampler<pbrt::LightHandle> *this,LightHandle *sample,Float weight)

{
  float fVar1;
  RNG *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  Float p;
  LightHandle *in_stack_ffffffffffffffd8;
  
  *(float *)&in_RDI[1].state = in_XMM0_Da + *(float *)&in_RDI[1].state;
  fVar1 = *(float *)&in_RDI[1].state;
  fVar2 = RNG::Uniform<float>(in_RDI);
  if (fVar2 < in_XMM0_Da / fVar1) {
    LightHandle::operator=((LightHandle *)in_RDI,in_stack_ffffffffffffffd8);
    *(float *)((long)&in_RDI[1].state + 4) = in_XMM0_Da;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void Add(const T &sample, Float weight) {
        weightSum += weight;
        // Randomly add _sample_ to reservoir
        Float p = weight / weightSum;
        if (rng.Uniform<Float>() < p) {
            reservoir = sample;
            reservoirWeight = weight;
        }

        DCHECK_LT(weightSum, 1e80);
    }